

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall CSlidingBucket::createbucket(CSlidingBucket *this,int bucketindex)

{
  int iVar1;
  AbstractSearchState ***pppAVar2;
  AbstractSearchState **ppAVar3;
  long lVar4;
  long lVar5;
  SBPL_Exception *this_00;
  ulong uVar6;
  
  pppAVar2 = this->bucketV;
  if (pppAVar2[bucketindex] != (AbstractSearchState **)0x0) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,"ERROR: trying to create a non-null bucket");
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = this->initialdynamicsize;
  if ((long)iVar1 == 0) {
    lVar4 = (long)this->bucketsize;
    uVar6 = 0xffffffffffffffff;
    if (-1 < lVar4) {
      uVar6 = lVar4 * 8;
    }
    ppAVar3 = (AbstractSearchState **)operator_new__(uVar6);
    pppAVar2[bucketindex] = ppAVar3;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        this->bucketV[bucketindex][lVar5] = (AbstractSearchState *)0x0;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
  }
  else {
    this->dynamicsize[bucketindex] = iVar1;
    ppAVar3 = (AbstractSearchState **)malloc((long)iVar1 << 3);
    pppAVar2[bucketindex] = ppAVar3;
    if (0 < this->dynamicsize[bucketindex]) {
      lVar4 = 0;
      do {
        this->bucketV[bucketindex][lVar4] = (AbstractSearchState *)0x0;
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->dynamicsize[bucketindex]);
    }
  }
  return;
}

Assistant:

void createbucket(int bucketindex)
    {
        if (bucketV[bucketindex] != NULL) {
            throw SBPL_Exception("ERROR: trying to create a non-null bucket");
        }

        if(initialdynamicsize)
        {
            dynamicsize[bucketindex] = initialdynamicsize;
            bucketV[bucketindex] = (AbstractSearchState**) malloc(sizeof(AbstractSearchState*) *  dynamicsize[bucketindex] );
            for (int eind = 0; eind < dynamicsize[bucketindex]; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
        else
        {
            bucketV[bucketindex] = new AbstractSearchState*[bucketsize];
            for (int eind = 0; eind < bucketsize; eind++)
                bucketV[bucketindex][eind] = NULL;
        }
    }